

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

void __thiscall
DynamicGraph::bfs(DynamicGraph *this,Vertex *s,vector<bool,_std::allocator<bool>_> *visited,
                 unsigned_long startingLevel)

{
  boost *this_00;
  value_type vVar1;
  size_t sVar2;
  bool bVar3;
  type_conflict tVar4;
  reference pvVar5;
  reference pvVar6;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *g_;
  reference rVar7;
  _Bit_reference local_f8;
  _Bit_reference local_e8;
  reference local_d8;
  unsigned_long local_c0;
  Vertex u;
  pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>_>
  local_a8;
  undefined1 local_88 [8];
  OutEdgeIterator ei_end;
  OutEdgeIterator ei;
  Vertex v;
  reference local_50;
  undefined1 local_40 [8];
  list<unsigned_long,_std::allocator<unsigned_long>_> queue;
  unsigned_long startingLevel_local;
  vector<bool,_std::allocator<bool>_> *visited_local;
  Vertex *s_local;
  DynamicGraph *this_local;
  
  queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size =
       startingLevel;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  sVar2 = queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
          _M_size;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->level,*s);
  *pvVar5 = sVar2;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,*s);
  std::_Bit_reference::operator=(&local_50,true);
  g_ = (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
        *)this->nextComponent;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->components,*s);
  *pvVar5 = (value_type)g_;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,s);
  while( true ) {
    bVar3 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    pvVar6 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::front
                       ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    this_00 = (boost *)*pvVar6;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    boost::detail::
    out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
    ::out_edge_iter((out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                     *)&ei_end.m_src);
    boost::detail::
    out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
    ::out_edge_iter((out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                     *)local_88);
    boost::
    out_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
              (&local_a8,this_00,(vertex_descriptor)this,g_);
    boost::tuples::
    tie<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>>
              ((tuples *)&u,
               (out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                *)&ei_end.m_src,
               (out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                *)local_88);
    boost::tuples::
    tuple<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
    ::operator=((tuple<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>*,std::vector<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>,std::allocator<boost::detail::stored_edge_iter<unsigned_long,std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::no_property>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
                 *)&u,&local_a8);
    while( true ) {
      tVar4 = boost::iterators::operator!=
                        ((iterator_facade<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                          *)&ei_end.m_src,
                         (iterator_facade<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                          *)local_88);
      if (!tVar4) break;
      boost::iterators::detail::
      iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
      ::operator*(&local_d8,
                  (iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                   *)&ei_end.m_src);
      local_c0 = boost::
                 target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                           (&local_d8.super_edge_base<boost::undirected_tag,_unsigned_long>,
                            &this->super_UndirectedGraph);
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,local_c0);
      local_e8._M_mask = rVar7._M_mask;
      g_ = (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
            *)rVar7._M_p;
      local_e8._M_p = (_Bit_type *)g_;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_e8);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->level,(size_type)this_00);
        vVar1 = *pvVar5;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->level,local_c0);
        *pvVar5 = vVar1 + 1;
        vVar1 = this->nextComponent;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->components,local_c0);
        *pvVar5 = vVar1;
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,local_c0);
        local_f8._M_mask = rVar7._M_mask;
        g_ = (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
              *)rVar7._M_p;
        local_f8._M_p = (_Bit_type *)g_;
        std::_Bit_reference::operator=(&local_f8,true);
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,&local_c0);
      }
      boost::iterators::detail::
      iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                    *)&ei_end.m_src);
    }
  }
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  return;
}

Assistant:

void DynamicGraph::bfs(const Vertex &s, std::vector<bool> &visited, const unsigned long startingLevel)
{
    std::list<Vertex> queue;
    this->level[s] = startingLevel;
    visited[s]=true;
    this->components[s] = this->nextComponent;
    queue.push_back(s);

    // Basic BFS
    while(!queue.empty()) {
        Vertex v = queue.front();
        queue.pop_front();

        OutEdgeIterator ei, ei_end;
        for(boost::tie(ei, ei_end) = out_edges(v, *this); ei != ei_end; ++ei) {
            Vertex u = target(*ei, *this);
            if(!visited[u]){
                level[u] = this->level[v]+1;
                this->components[u] = this->nextComponent;
                visited[u]=true;
                queue.push_back(u);
            }
        }
    }
}